

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O0

int nni_posix_resolv_sysinit(nng_init_params *params)

{
  int iVar1;
  int local_24;
  int i_1;
  int rv;
  int i;
  nng_init_params *params_local;
  
  nni_mtx_init(&resolv_mtx);
  nni_cv_init(&resolv_cv,&resolv_mtx);
  resolv_fini = false;
  nni_aio_list_init(&resolv_aios);
  resolv_num_thr = params->num_resolver_threads;
  if (resolv_num_thr < 1) {
    resolv_num_thr = 1;
  }
  params->num_resolver_threads = resolv_num_thr;
  resolv_thrs = (nni_thr *)nni_zalloc((long)resolv_num_thr * 0x98);
  resolv_active = (nni_aio **)nni_zalloc((long)resolv_num_thr << 3);
  if ((resolv_thrs == (nni_thr *)0x0) || (resolv_active == (nni_aio **)0x0)) {
    nni_posix_resolv_sysfini();
    params_local._4_4_ = 2;
  }
  else {
    for (i_1 = 0; i_1 < resolv_num_thr; i_1 = i_1 + 1) {
      iVar1 = nni_thr_init(resolv_thrs + i_1,resolv_worker,(void *)(long)i_1);
      if (iVar1 != 0) {
        nni_posix_resolv_sysfini();
        return iVar1;
      }
    }
    for (local_24 = 0; local_24 < resolv_num_thr; local_24 = local_24 + 1) {
      nni_thr_run(resolv_thrs + local_24);
    }
    params_local._4_4_ = 0;
  }
  return params_local._4_4_;
}

Assistant:

int
nni_posix_resolv_sysinit(nng_init_params *params)
{
	nni_mtx_init(&resolv_mtx);
	nni_cv_init(&resolv_cv, &resolv_mtx);
	resolv_fini = false;
	nni_aio_list_init(&resolv_aios);

	resolv_num_thr = params->num_resolver_threads;
	if (resolv_num_thr < 1) {
		resolv_num_thr = 1;
	}
	params->num_resolver_threads = resolv_num_thr;
	// no limit on the maximum for now
	resolv_thrs   = NNI_ALLOC_STRUCTS(resolv_thrs, resolv_num_thr);
	resolv_active = nni_zalloc(sizeof(nni_aio *) * resolv_num_thr);
	if (resolv_thrs == NULL || resolv_active == NULL) {
		nni_posix_resolv_sysfini();
		return (NNG_ENOMEM);
	}

	for (int i = 0; i < resolv_num_thr; i++) {
		int rv = nni_thr_init(
		    &resolv_thrs[i], resolv_worker, (void *) (intptr_t) i);
		if (rv != 0) {
			nni_posix_resolv_sysfini();
			return (rv);
		}
	}
	for (int i = 0; i < resolv_num_thr; i++) {
		nni_thr_run(&resolv_thrs[i]);
	}

	return (0);
}